

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

XmlWriter * __thiscall
Catch::XmlWriter::writeAttribute<unsigned_long>
          (XmlWriter *this,string *name,unsigned_long *attribute)

{
  ReusableStringStream rss;
  ReusableStringStream local_50;
  string local_40;
  
  ReusableStringStream::ReusableStringStream(&local_50);
  ReusableStringStream::operator<<(&local_50,attribute);
  std::__cxx11::stringbuf::str();
  writeAttribute(this,name,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  ReusableStringStream::~ReusableStringStream(&local_50);
  return this;
}

Assistant:

XmlWriter& writeAttribute( std::string const& name, T const& attribute ) {
            ReusableStringStream rss;
            rss << attribute;
            return writeAttribute( name, rss.str() );
        }